

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O2

ssh_rportfwd *
ssh1_rportfwd_alloc(ConnectionLayer *cl,char *shost,int sport,char *dhost,int dport,
                   int addressfamily,char *log_description,PortFwdRecord *pfr,
                   ssh_sharing_connstate *share_ctx)

{
  BinarySink *bs;
  ssh_rportfwd *rpf;
  char *pcVar1;
  ssh_rportfwd *psVar2;
  long lVar3;
  
  rpf = (ssh_rportfwd *)safemalloc(1,0x38,0);
  pcVar1 = dupstr(shost);
  rpf->shost = pcVar1;
  rpf->sport = sport;
  pcVar1 = dupstr(dhost);
  rpf->dhost = pcVar1;
  rpf->dport = dport;
  rpf->addressfamily = addressfamily;
  pcVar1 = dupstr(log_description);
  rpf->log_description = pcVar1;
  rpf->pfr = pfr;
  psVar2 = (ssh_rportfwd *)add234((tree234 *)cl[-6].logctx,rpf);
  if (psVar2 == rpf) {
    lVar3 = (**(code **)((cl[1].vt)->rportfwd_alloc + 0x18))(0x1c);
    bs = (BinarySink *)(lVar3 + 0x60);
    BinarySink_put_uint32(bs,(ulong)rpf->sport);
    BinarySink_put_stringz(bs,rpf->dhost);
    BinarySink_put_uint32(bs,(ulong)rpf->dport);
    pq_base_push((PacketQueueBase *)cl[2].vt,(PacketQueueNode *)(lVar3 + 0x40));
    ssh1_queue_succfail_handler
              ((ssh1_connection_state *)(cl + -0xe),ssh1_rportfwd_response,rpf,false);
  }
  else {
    free_rportfwd(rpf);
    rpf = (ssh_rportfwd *)0x0;
  }
  return rpf;
}

Assistant:

struct ssh_rportfwd *ssh1_rportfwd_alloc(
    ConnectionLayer *cl,
    const char *shost, int sport, const char *dhost, int dport,
    int addressfamily, const char *log_description, PortFwdRecord *pfr,
    ssh_sharing_connstate *share_ctx)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);
    struct ssh_rportfwd *rpf = snew(struct ssh_rportfwd);

    rpf->shost = dupstr(shost);
    rpf->sport = sport;
    rpf->dhost = dupstr(dhost);
    rpf->dport = dport;
    rpf->addressfamily = addressfamily;
    rpf->log_description = dupstr(log_description);
    rpf->pfr = pfr;

    if (add234(s->rportfwds, rpf) != rpf) {
        free_rportfwd(rpf);
        return NULL;
    }

    PktOut *pktout = ssh_bpp_new_pktout(
        s->ppl.bpp, SSH1_CMSG_PORT_FORWARD_REQUEST);
    put_uint32(pktout, rpf->sport);
    put_stringz(pktout, rpf->dhost);
    put_uint32(pktout, rpf->dport);
    pq_push(s->ppl.out_pq, pktout);

    ssh1_queue_succfail_handler(s, ssh1_rportfwd_response, rpf, false);

    return rpf;
}